

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjFileImporter.cpp
# Opt level: O0

aiNode * __thiscall
Assimp::ObjFileImporter::createNodes
          (ObjFileImporter *this,Model *pModel,Object *pObject,aiNode *pParent,aiScene *pScene,
          vector<aiMesh_*,_std::allocator<aiMesh_*>_> *MeshArray)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  bool bVar3;
  aiNode *paVar4;
  size_type sVar5;
  const_reference pvVar6;
  aiMesh *this_00;
  ulong uVar7;
  aiNode **ppaVar8;
  uint *puVar9;
  ulong uVar10;
  aiNode *local_98;
  size_t i_1;
  size_t index;
  size_t meshSizeDiff;
  size_t numChilds;
  aiMesh *pMesh;
  ulong uStack_68;
  uint meshId;
  size_t i;
  aiNode *local_50;
  aiNode *pNode;
  size_t oldMeshSize;
  vector<aiMesh_*,_std::allocator<aiMesh_*>_> *MeshArray_local;
  aiScene *pScene_local;
  aiNode *pParent_local;
  Object *pObject_local;
  Model *pModel_local;
  ObjFileImporter *this_local;
  
  oldMeshSize = (size_t)MeshArray;
  MeshArray_local = (vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)pScene;
  pScene_local = (aiScene *)pParent;
  pParent_local = (aiNode *)pObject;
  pObject_local = (Object *)pModel;
  pModel_local = (Model *)this;
  if (pModel == (Model *)0x0) {
    __assert_fail("__null != pModel",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Obj/ObjFileImporter.cpp"
                  ,0x104,
                  "aiNode *Assimp::ObjFileImporter::createNodes(const ObjFile::Model *, const ObjFile::Object *, aiNode *, aiScene *, std::vector<aiMesh *> &)"
                 );
  }
  if (pObject == (Object *)0x0) {
    this_local = (ObjFileImporter *)0x0;
  }
  else {
    pNode = (aiNode *)std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::size(MeshArray);
    paVar4 = (aiNode *)operator_new(0x478);
    aiNode::aiNode(paVar4);
    local_50 = paVar4;
    aiString::operator=((aiString *)paVar4,(string *)pParent_local);
    if (pScene_local == (aiScene *)0x0) {
      __assert_fail("__null != pParent",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Obj/ObjFileImporter.cpp"
                    ,0x110,
                    "aiNode *Assimp::ObjFileImporter::createNodes(const ObjFile::Model *, const ObjFile::Object *, aiNode *, aiScene *, std::vector<aiMesh *> &)"
                   );
    }
    appendChildToParentNode(this,(aiNode *)pScene_local,local_50);
    for (uStack_68 = 0; uVar7 = uStack_68,
        sVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                           ((pParent_local->mName).data + 0x74)), uVar7 < sVar5;
        uStack_68 = uStack_68 + 1) {
      pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                          ((pParent_local->mName).data + 0x74),uStack_68);
      pMesh._4_4_ = *pvVar6;
      this_00 = createTopology(this,(Model *)pObject_local,(Object *)pParent_local,pMesh._4_4_);
      numChilds = (size_t)this_00;
      if (this_00 != (aiMesh *)0x0) {
        if (this_00->mNumFaces == 0) {
          if (this_00 != (aiMesh *)0x0) {
            aiMesh::~aiMesh(this_00);
            operator_delete(this_00,0x520);
          }
        }
        else {
          std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::push_back
                    ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)oldMeshSize,
                     (value_type *)&numChilds);
        }
      }
    }
    bVar3 = std::vector<Assimp::ObjFile::Object_*,_std::allocator<Assimp::ObjFile::Object_*>_>::
            empty((vector<Assimp::ObjFile::Object_*,_std::allocator<Assimp::ObjFile::Object_*>_> *)
                  ((pParent_local->mName).data + 0x5c));
    if (!bVar3) {
      sVar5 = std::vector<Assimp::ObjFile::Object_*,_std::allocator<Assimp::ObjFile::Object_*>_>::
              size((vector<Assimp::ObjFile::Object_*,_std::allocator<Assimp::ObjFile::Object_*>_> *)
                   ((pParent_local->mName).data + 0x5c));
      local_50->mNumChildren = (uint)sVar5;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = sVar5;
      uVar7 = SUB168(auVar1 * ZEXT816(8),0);
      if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
        uVar7 = 0xffffffffffffffff;
      }
      ppaVar8 = (aiNode **)operator_new__(uVar7);
      local_50->mChildren = ppaVar8;
      local_50->mNumMeshes = 1;
      puVar9 = (uint *)operator_new__(4);
      local_50->mMeshes = puVar9;
    }
    sVar5 = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::size
                      ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)oldMeshSize);
    uVar7 = sVar5 - (long)pNode;
    if (uVar7 != 0) {
      auVar2._8_8_ = 0;
      auVar2._0_8_ = uVar7;
      uVar10 = SUB168(auVar2 * ZEXT816(4),0);
      if (SUB168(auVar2 * ZEXT816(4),8) != 0) {
        uVar10 = 0xffffffffffffffff;
      }
      puVar9 = (uint *)operator_new__(uVar10);
      local_50->mMeshes = puVar9;
      local_50->mNumMeshes = (uint)uVar7;
      i_1 = 0;
      for (local_98 = pNode;
          paVar4 = (aiNode *)
                   std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::size
                             ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)oldMeshSize),
          local_98 < paVar4; local_98 = (aiNode *)((long)&(local_98->mName).length + 1)) {
        local_50->mMeshes[i_1] =
             *(uint *)&(MeshArray_local->super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>).
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        *(int *)&(MeshArray_local->super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>)._M_impl.
                 super__Vector_impl_data._M_end_of_storage =
             *(int *)&(MeshArray_local->super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>).
                      _M_impl.super__Vector_impl_data._M_end_of_storage + 1;
        i_1 = i_1 + 1;
      }
    }
    this_local = (ObjFileImporter *)local_50;
  }
  return (aiNode *)this_local;
}

Assistant:

aiNode *ObjFileImporter::createNodes(const ObjFile::Model* pModel, const ObjFile::Object* pObject,
                                     aiNode *pParent, aiScene* pScene,
                                     std::vector<aiMesh*> &MeshArray )
{
    ai_assert( NULL != pModel );
    if( NULL == pObject ) {
        return NULL;
    }

    // Store older mesh size to be able to computes mesh offsets for new mesh instances
    const size_t oldMeshSize = MeshArray.size();
    aiNode *pNode = new aiNode;

    pNode->mName = pObject->m_strObjName;

    // If we have a parent node, store it
    ai_assert( NULL != pParent );
    appendChildToParentNode( pParent, pNode );

    for ( size_t i=0; i< pObject->m_Meshes.size(); ++i ) {
        unsigned int meshId = pObject->m_Meshes[ i ];
        aiMesh *pMesh = createTopology( pModel, pObject, meshId );
        if( pMesh ) {
            if (pMesh->mNumFaces > 0) {
                MeshArray.push_back( pMesh );
            } else {
                delete pMesh;
            }
        }
    }

    // Create all nodes from the sub-objects stored in the current object
    if ( !pObject->m_SubObjects.empty() ) {
        size_t numChilds = pObject->m_SubObjects.size();
        pNode->mNumChildren = static_cast<unsigned int>( numChilds );
        pNode->mChildren = new aiNode*[ numChilds ];
        pNode->mNumMeshes = 1;
        pNode->mMeshes = new unsigned int[ 1 ];
    }

    // Set mesh instances into scene- and node-instances
    const size_t meshSizeDiff = MeshArray.size()- oldMeshSize;
    if ( meshSizeDiff > 0 ) {
        pNode->mMeshes = new unsigned int[ meshSizeDiff ];
        pNode->mNumMeshes = static_cast<unsigned int>( meshSizeDiff );
        size_t index = 0;
        for (size_t i = oldMeshSize; i < MeshArray.size(); ++i ) {
            pNode->mMeshes[ index ] = pScene->mNumMeshes;
            pScene->mNumMeshes++;
            ++index;
        }
    }

    return pNode;
}